

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

void __thiscall tinyxml2::XMLElement::DeleteAttribute(XMLElement *this,char *name)

{
  MemPool *pMVar1;
  int iVar2;
  char *__s2;
  XMLAttribute **ppXVar3;
  XMLAttribute *pXVar4;
  XMLAttribute *pXVar5;
  XMLAttribute *pXVar6;
  
  pXVar6 = this->_rootAttribute;
  if (pXVar6 == (XMLAttribute *)0x0) {
    return;
  }
  __s2 = StrPair::GetStr(&pXVar6->_name);
  if (__s2 == name) {
    pXVar4 = (XMLAttribute *)0x0;
  }
  else {
    pXVar4 = (XMLAttribute *)0x0;
    pXVar5 = pXVar6;
    do {
      iVar2 = strncmp(name,__s2,0x7fffffff);
      pXVar6 = pXVar5;
      if (iVar2 == 0) break;
      pXVar6 = pXVar5->_next;
      if (pXVar6 == (XMLAttribute *)0x0) {
        return;
      }
      __s2 = StrPair::GetStr(&pXVar6->_name);
      pXVar4 = pXVar5;
      pXVar5 = pXVar6;
    } while (__s2 != name);
  }
  ppXVar3 = &pXVar4->_next;
  if (pXVar4 == (XMLAttribute *)0x0) {
    ppXVar3 = &this->_rootAttribute;
  }
  *ppXVar3 = pXVar6->_next;
  pMVar1 = pXVar6->_memPool;
  (**pXVar6->_vptr_XMLAttribute)(pXVar6);
  (*pMVar1->_vptr_MemPool[4])(pMVar1,pXVar6);
  return;
}

Assistant:

void XMLElement::DeleteAttribute( const char* name )
{
    XMLAttribute* prev = 0;
    for( XMLAttribute* a=_rootAttribute; a; a=a->_next ) {
        if ( XMLUtil::StringEqual( name, a->Name() ) ) {
            if ( prev ) {
                prev->_next = a->_next;
            }
            else {
                _rootAttribute = a->_next;
            }
            DeleteAttribute( a );
            break;
        }
        prev = a;
    }
}